

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int gm_mt_worker_hook(void *arg1,void *unused)

{
  _Bool _Var1;
  AV1_COMP *cpi;
  long lVar2;
  pthread_mutex_t *__mutex;
  int iVar3;
  int iVar4;
  uint cur_dir;
  int ref_buf_idx;
  WarpedMotionParams *local_50;
  YV12_BUFFER_CONFIG **local_48;
  MotionModel *local_40;
  void *local_38;
  
  cpi = *arg1;
  lVar2 = *(long *)((long)arg1 + 8);
  iVar4 = *(int *)((long)arg1 + 0x1cc);
  __mutex = (cpi->mt_info).gm_sync.mutex_;
  *(aom_internal_error_info **)(lVar2 + 0x2b90) = (aom_internal_error_info *)((long)arg1 + 0x18);
  iVar3 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar3 == 0) {
    local_40 = (MotionModel *)(lVar2 + 0x26df8);
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    cur_dir = (uint)(cpi->mt_info).gm_sync.job_info.thread_id_to_dir[iVar4];
    local_48 = (cpi->gm_info).ref_buf;
    local_50 = (cpi->common).global_motion;
    local_38 = arg1;
    while( true ) {
      ref_buf_idx = -1;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      _Var1 = (cpi->mt_info).gm_sync.gm_mt_exit;
      if (_Var1 == false) {
        iVar4 = get_next_gm_job(cpi,&ref_buf_idx,cur_dir);
        if ((iVar4 == 0) && ((cpi->sf).gm_sf.prune_ref_frame_for_gm_search == 0)) {
          cur_dir = (uint)(cur_dir == 0);
          get_next_gm_job(cpi,&ref_buf_idx,cur_dir);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar4 = ref_buf_idx;
      if ((_Var1 != false) || (ref_buf_idx == -1)) break;
      av1_compute_gm_for_valid_ref_frames
                (cpi,(aom_internal_error_info *)((long)arg1 + 0x18),local_48,ref_buf_idx,local_40,
                 *(uint8_t **)(lVar2 + 0x26e38),(cpi->gm_info).segment_map_w,
                 (cpi->gm_info).segment_map_h);
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (((cpi->sf).gm_sf.prune_ref_frame_for_gm_search != 0) && (local_50[iVar4].wmtype < 2)) {
        (cpi->mt_info).gm_sync.job_info.early_exit[(int)cur_dir] = '\x01';
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    *(undefined4 *)((long)local_38 + 0xe8) = 0;
    iVar4 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (cpi->mt_info).gm_sync.gm_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int gm_mt_worker_hook(void *arg1, void *unused) {
  (void)unused;

  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1_COMP *cpi = thread_data->cpi;
  GlobalMotionInfo *gm_info = &cpi->gm_info;
  AV1GlobalMotionSync *gm_sync = &cpi->mt_info.gm_sync;
  GlobalMotionJobInfo *job_info = &gm_sync->job_info;
  int thread_id = thread_data->thread_id;
  GlobalMotionData *gm_thread_data = &thread_data->td->gm_data;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *gm_mt_mutex_ = gm_sync->mutex_;
#endif

  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(gm_mt_mutex_);
    gm_sync->gm_mt_exit = true;
    pthread_mutex_unlock(gm_mt_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  int cur_dir = job_info->thread_id_to_dir[thread_id];
  bool gm_mt_exit = false;
  while (1) {
    int ref_buf_idx = -1;

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(gm_mt_mutex_);
#endif

    gm_mt_exit = gm_sync->gm_mt_exit;
    // Populates ref_buf_idx(the reference frame type) for which global motion
    // estimation will be done.
    if (!gm_mt_exit && !get_next_gm_job(cpi, &ref_buf_idx, cur_dir)) {
      // No jobs are available for the current direction. Switch
      // to other direction and get the next job, if available.
      switch_direction(cpi, &ref_buf_idx, &cur_dir);
    }

#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(gm_mt_mutex_);
#endif

    // When gm_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (gm_mt_exit || ref_buf_idx == -1) break;

    // Compute global motion for the given ref_buf_idx.
    av1_compute_gm_for_valid_ref_frames(
        cpi, error_info, gm_info->ref_buf, ref_buf_idx,
        gm_thread_data->motion_models, gm_thread_data->segment_map,
        gm_info->segment_map_w, gm_info->segment_map_h);

#if CONFIG_MULTITHREAD
    pthread_mutex_lock(gm_mt_mutex_);
#endif
    // If global motion w.r.t. current ref frame is
    // INVALID/TRANSLATION/IDENTITY, skip the evaluation of global motion w.r.t
    // the remaining ref frames in that direction.
    if (cpi->sf.gm_sf.prune_ref_frame_for_gm_search &&
        cpi->common.global_motion[ref_buf_idx].wmtype <= TRANSLATION)
      job_info->early_exit[cur_dir] = 1;

#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(gm_mt_mutex_);
#endif
  }
  error_info->setjmp = 0;
  return 1;
}